

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::TestSpec::Filter::name_abi_cxx11_(Filter *this)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  string *in_RDI;
  shared_ptr<Catch::TestSpec::Pattern> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  string *name;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffff98;
  string *this_01;
  __normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_28[0]._M_current =
       (shared_ptr<Catch::TestSpec::Pattern> *)
       clara::std::
       vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
       ::begin(in_stack_ffffffffffffff98);
  clara::std::
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                             *)this_01,
                            (__normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator*(local_28);
    this_00 = clara::std::
              __shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2469a5);
    psVar2 = Pattern::name_abi_cxx11_(this_00);
    std::__cxx11::string::operator+=((string *)this_01,(string *)psVar2);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(local_28);
  }
  return in_RDI;
}

Assistant:

std::string TestSpec::Filter::name() const {
        std::string name;
        for( auto const& p : m_patterns )
            name += p->name();
        return name;
    }